

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_CreateDirectory_Test::TestBody
          (CommandLineInterfaceTest_CreateDirectory_Test *this)

{
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_71;
  string local_70;
  string_view local_50;
  string_view local_40;
  string_view local_30;
  string_view local_20;
  CommandLineInterfaceTest_CreateDirectory_Test *local_10;
  CommandLineInterfaceTest_CreateDirectory_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_20,"bar/baz/foo.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,"syntax = \"proto2\";\nmessage Foo {}\n");
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_20,local_30);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,"out");
  CommandLineInterfaceTester::CreateTempDir((CommandLineInterfaceTester *)this,local_40);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,"plugout");
  CommandLineInterfaceTester::CreateTempDir((CommandLineInterfaceTester *)this,local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,
             "protocol_compiler --test_out=$tmpdir/out --plug_out=$tmpdir/plugout --proto_path=$tmpdir bar/baz/foo.proto"
             ,&local_71);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"test_generator",&local_a9)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,anon_var_dwarf_37cdd0 + 5,&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"bar/baz/foo.proto",&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"Foo",&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"out",&local_149);
  CommandLineInterfaceTest::ExpectGenerated
            (&this->super_CommandLineInterfaceTest,&local_a8,&local_d0,&local_f8,&local_120,
             &local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"test_plugin",&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,anon_var_dwarf_37cdd0 + 5,&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"bar/baz/foo.proto",&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"Foo",&local_1e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"plugout",&local_211);
  CommandLineInterfaceTest::ExpectGenerated
            (&this->super_CommandLineInterfaceTest,&local_170,&local_198,&local_1c0,&local_1e8,
             &local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, CreateDirectory) {
  // Test that when we output to a sub-directory, it is created.

  CreateTempFile("bar/baz/foo.proto",
                 "syntax = \"proto2\";\n"
                 "message Foo {}\n");
  CreateTempDir("out");
  CreateTempDir("plugout");

  Run("protocol_compiler --test_out=$tmpdir/out --plug_out=$tmpdir/plugout "
      "--proto_path=$tmpdir bar/baz/foo.proto");

  ExpectNoErrors();
  ExpectGenerated("test_generator", "", "bar/baz/foo.proto", "Foo", "out");
  ExpectGenerated("test_plugin", "", "bar/baz/foo.proto", "Foo", "plugout");
}